

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

RtAudioErrorType __thiscall
RtApi::openStream(RtApi *this,StreamParameters *oParams,StreamParameters *iParams,
                 RtAudioFormat format,uint sampleRate,uint *bufferFrames,RtAudioCallback callback,
                 void *userData,StreamOptions *options)

{
  uint uVar1;
  RtAudioErrorType RVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_54;
  uint uStack_50;
  bool result;
  uint iChannels;
  uint oChannels;
  uint m;
  uint *bufferFrames_local;
  uint sampleRate_local;
  RtAudioFormat format_local;
  StreamParameters *iParams_local;
  StreamParameters *oParams_local;
  RtApi *this_local;
  
  if ((this->stream_).state == STREAM_CLOSED) {
    clearStreamInfo(this);
    if ((oParams == (StreamParameters *)0x0) || (oParams->nChannels != 0)) {
      if ((iParams == (StreamParameters *)0x0) || (iParams->nChannels != 0)) {
        if ((oParams == (StreamParameters *)0x0) && (iParams == (StreamParameters *)0x0)) {
          std::__cxx11::string::operator=
                    ((string *)&this->errorText_,
                     "RtApi::openStream: input and output StreamParameters structures are both NULL!"
                    );
          this_local._4_4_ = error(this,RTAUDIO_INVALID_PARAMETER);
        }
        else {
          uVar1 = formatBytes(this,format);
          if (uVar1 == 0) {
            std::__cxx11::string::operator=
                      ((string *)&this->errorText_,
                       "RtApi::openStream: \'format\' parameter value is undefined.");
            this_local._4_4_ = error(this,RTAUDIO_INVALID_PARAMETER);
          }
          else {
            sVar3 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                              (&this->deviceList_);
            if (sVar3 == 0) {
              (*this->_vptr_RtApi[0xb])();
            }
            uStack_50 = 0;
            if (oParams != (StreamParameters *)0x0) {
              uStack_50 = oParams->nChannels;
              iChannels = 0;
              while ((sVar3 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                              ::size(&this->deviceList_), iChannels < sVar3 &&
                     (pvVar4 = std::
                               vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::
                               operator[](&this->deviceList_,(ulong)iChannels),
                     pvVar4->ID != oParams->deviceId))) {
                iChannels = iChannels + 1;
              }
              sVar3 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                                (&this->deviceList_);
              if (iChannels == sVar3) {
                std::__cxx11::string::operator=
                          ((string *)&this->errorText_,
                           "RtApi::openStream: output device ID is invalid.");
                RVar2 = error(this,RTAUDIO_INVALID_PARAMETER);
                return RVar2;
              }
            }
            local_54 = 0;
            if (iParams != (StreamParameters *)0x0) {
              local_54 = iParams->nChannels;
              iChannels = 0;
              while ((sVar3 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                              ::size(&this->deviceList_), iChannels < sVar3 &&
                     (pvVar4 = std::
                               vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::
                               operator[](&this->deviceList_,(ulong)iChannels),
                     pvVar4->ID != iParams->deviceId))) {
                iChannels = iChannels + 1;
              }
              sVar3 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                                (&this->deviceList_);
              if (iChannels == sVar3) {
                std::__cxx11::string::operator=
                          ((string *)&this->errorText_,
                           "RtApi::openStream: input device ID is invalid.");
                RVar2 = error(this,RTAUDIO_INVALID_PARAMETER);
                return RVar2;
              }
            }
            if ((uStack_50 == 0) ||
               (uVar1 = (*this->_vptr_RtApi[0xc])
                                  (this,(ulong)oParams->deviceId,0,(ulong)uStack_50,
                                   (ulong)oParams->firstChannel,(ulong)sampleRate,format,
                                   bufferFrames,options), (uVar1 & 1) != 0)) {
              if ((local_54 == 0) ||
                 (uVar1 = (*this->_vptr_RtApi[0xc])
                                    (this,(ulong)iParams->deviceId,1,(ulong)local_54,
                                     (ulong)iParams->firstChannel,(ulong)sampleRate,format,
                                     bufferFrames,options), (uVar1 & 1) != 0)) {
                (this->stream_).callbackInfo.callback = callback;
                (this->stream_).callbackInfo.userData = userData;
                if (options != (StreamOptions *)0x0) {
                  options->numberOfBuffers = (this->stream_).nBuffers;
                }
                (this->stream_).state = STREAM_STOPPED;
                this_local._4_4_ = RTAUDIO_NO_ERROR;
              }
              else {
                this_local._4_4_ = error(this,RTAUDIO_SYSTEM_ERROR);
              }
            }
            else {
              this_local._4_4_ = error(this,RTAUDIO_SYSTEM_ERROR);
            }
          }
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&this->errorText_,
                   "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one."
                  );
        this_local._4_4_ = error(this,RTAUDIO_INVALID_PARAMETER);
      }
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&this->errorText_,
                 "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one."
                );
      this_local._4_4_ = error(this,RTAUDIO_INVALID_PARAMETER);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->errorText_,"RtApi::openStream: a stream is already open!");
    this_local._4_4_ = error(this,RTAUDIO_INVALID_USE);
  }
  return this_local._4_4_;
}

Assistant:

RtAudioErrorType RtApi :: openStream( RtAudio::StreamParameters *oParams,
                                      RtAudio::StreamParameters *iParams,
                                      RtAudioFormat format, unsigned int sampleRate,
                                      unsigned int *bufferFrames,
                                      RtAudioCallback callback, void *userData,
                                      RtAudio::StreamOptions *options )
{
  if ( stream_.state != STREAM_CLOSED ) {
    errorText_ = "RtApi::openStream: a stream is already open!";
    return error( RTAUDIO_INVALID_USE );
  }

  // Clear stream information potentially left from a previously open stream.
  clearStreamInfo();

  if ( oParams && oParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( iParams && iParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( oParams == NULL && iParams == NULL ) {
    errorText_ = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( formatBytes(format) == 0 ) {
    errorText_ = "RtApi::openStream: 'format' parameter value is undefined.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  // Scan devices if none currently listed.
  if ( deviceList_.size() == 0 ) probeDevices();
  
  unsigned int m, oChannels = 0;
  if ( oParams ) {
    oChannels = oParams->nChannels;
    // Verify that the oParams->deviceId is found in our list
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == oParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: output device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  unsigned int iChannels = 0;
  if ( iParams ) {
    iChannels = iParams->nChannels;
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == iParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: input device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  bool result;

  if ( oChannels > 0 ) {

    result = probeDeviceOpen( oParams->deviceId, OUTPUT, oChannels, oParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  if ( iChannels > 0 ) {

    result = probeDeviceOpen( iParams->deviceId, INPUT, iChannels, iParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  stream_.callbackInfo.callback = (void *) callback;
  stream_.callbackInfo.userData = userData;

  if ( options ) options->numberOfBuffers = stream_.nBuffers;
  stream_.state = STREAM_STOPPED;
  return RTAUDIO_NO_ERROR;
}